

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O2

ktx_error_code_e ktxHashListEntry_GetValue(ktxHashListEntry *This,uint *pValueLen,void **ppValue)

{
  uint uVar1;
  void *pvVar2;
  
  if (ppValue != (void **)0x0 && pValueLen != (uint *)0x0) {
    uVar1 = This->valueLen;
    *pValueLen = uVar1;
    if (uVar1 == 0) {
      pvVar2 = (void *)0x0;
    }
    else {
      pvVar2 = This->value;
    }
    *ppValue = pvVar2;
    return KTX_SUCCESS;
  }
  return KTX_INVALID_VALUE;
}

Assistant:

KTX_error_code
ktxHashListEntry_GetValue(ktxHashListEntry* This,
                          unsigned int* pValueLen, void** ppValue)
{
    if (pValueLen && ppValue) {
        ktxKVListEntry* kv = (ktxKVListEntry*)This;
        *pValueLen = kv->valueLen;
        *ppValue = kv->valueLen > 0 ? kv->value : NULL;
        return KTX_SUCCESS;
    } else
        return KTX_INVALID_VALUE;
}